

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

string * __thiscall
libcellml::Variable::interfaceType_abi_cxx11_(string *__return_storage_ptr__,Variable *this)

{
  VariableImpl *pVVar1;
  Variable *this_local;
  
  pVVar1 = pFunc(this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pVVar1->mInterfaceType);
  return __return_storage_ptr__;
}

Assistant:

std::string Variable::interfaceType() const
{
    return pFunc()->mInterfaceType;
}